

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystemDescriptor.cpp
# Opt level: O2

int __thiscall
chrono::ChSystemDescriptor::FromConstraintsToVector
          (ChSystemDescriptor *this,ChVectorDynamic<> *mvector,bool resize_vector)

{
  Scalar SVar1;
  pointer ppCVar2;
  pointer ppCVar3;
  ChConstraint *pCVar4;
  int iVar5;
  Scalar *pSVar6;
  undefined3 in_register_00000011;
  size_t ic;
  ulong uVar7;
  
  if (CONCAT31(in_register_00000011,resize_vector) != 0) {
    iVar5 = (*this->_vptr_ChSystemDescriptor[8])(this);
    this->n_c = iVar5;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
              (&mvector->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar5)
    ;
  }
  ppCVar2 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppCVar3 = (this->vconstraints).
            super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  for (uVar7 = 0; uVar7 < (ulong)(long)(int)((ulong)((long)ppCVar2 - (long)ppCVar3) >> 3);
      uVar7 = uVar7 + 1) {
    pCVar4 = (this->vconstraints).
             super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar7];
    if (pCVar4->active == true) {
      SVar1 = pCVar4->l_i;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)mvector,
                          (long)pCVar4->offset);
      *pSVar6 = SVar1;
    }
  }
  return this->n_c;
}

Assistant:

int ChSystemDescriptor::FromConstraintsToVector(ChVectorDynamic<>& mvector, bool resize_vector) {
    // Count active constraints and resize vector if necessary
    if (resize_vector) {
        n_c = CountActiveConstraints();
        mvector.setZero(n_c);
    }

    auto vc_size = (int)vconstraints.size();

    // Fill the vector
    for (size_t ic = 0; ic < vc_size; ic++) {
        if (vconstraints[ic]->IsActive()) {
            mvector(vconstraints[ic]->GetOffset()) = vconstraints[ic]->Get_l_i();
        }
    }

    return n_c;
}